

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O2

int asn1_string_get_int64(int64_t *out,ASN1_STRING *a,int type)

{
  int iVar1;
  uint64_t in_RAX;
  byte bVar2;
  bool bVar3;
  uint64_t v;
  
  v = in_RAX;
  iVar1 = asn1_string_get_abs_uint64(&v,a,type);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    bVar2 = v != 0 & *(byte *)((long)&a->type + 1);
    bVar3 = -1 < (long)v;
    if (bVar2 != 0) {
      bVar3 = SUB81(-v >> 0x3f,0);
    }
    if (bVar3 == false) {
      iVar1 = 0;
      ERR_put_error(0xc,0,0xc4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                    ,0x151);
    }
    else {
      if (bVar2 != 0) {
        v = -v;
      }
      *out = v;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int asn1_string_get_int64(int64_t *out, const ASN1_STRING *a, int type) {
  uint64_t v;
  if (!asn1_string_get_abs_uint64(&v, a, type)) {
    return 0;
  }
  int64_t i64;
  int fits_in_i64;
  // Check |v != 0| to handle manually-constructed negative zeros.
  if ((a->type & V_ASN1_NEG) && v != 0) {
    i64 = (int64_t)(0u - v);
    fits_in_i64 = i64 < 0;
  } else {
    i64 = (int64_t)v;
    fits_in_i64 = i64 >= 0;
  }
  if (!fits_in_i64) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_INTEGER);
    return 0;
  }
  *out = i64;
  return 1;
}